

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O2

bool template_image::_AssignmentOperator<unsigned_char>(void)

{
  uchar colorCount_;
  uchar alignment_;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  EVP_PKEY_CTX *src;
  uint uVar6;
  ImageTemplate<unsigned_char> image_copy;
  ImageTemplate<unsigned_char> image;
  
  uVar6 = 0;
  do {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar6) {
LAB_0013179a:
      return uVar2 <= uVar6;
    }
    uVar3 = rand();
    uVar4 = rand();
    colorCount_ = Test_Helper::randomValue<unsigned_char>('\x01',4);
    alignment_ = Test_Helper::randomValue<unsigned_char>('\x01',0x20);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&image,uVar3 & 0x3ff,uVar4 & 0x3ff,colorCount_,alignment_);
    iVar5 = rand();
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(&image,(uchar)iVar5);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&image_copy,0,0,'\x01','\x01');
    PenguinV_Image::ImageTemplate<unsigned_char>::copy(&image_copy,(EVP_PKEY_CTX *)&image,src);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>(&image,&image_copy);
    if (!bVar1) {
LAB_00131783:
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image_copy);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
      goto LAB_0013179a;
    }
    bVar1 = Unit_Test::equalData<unsigned_char>(&image,&image_copy);
    if (!bVar1) goto LAB_00131783;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image_copy);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool _AssignmentOperator()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            PenguinV_Image::ImageTemplate < _Type > image( width, height, colorCount, alignment );
            image.fill( static_cast<_Type>( Unit_Test::randomValue<uint8_t>( 256u ) ) );

            PenguinV_Image::ImageTemplate < _Type > image_copy;

            image_copy = image;

            if( !Unit_Test::equalSize( image, image_copy ) || !Unit_Test::equalData( image, image_copy ) )
                return false;
        }

        return true;
    }